

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O1

HaU32 HACD::kmeans_cluster<HACD::Vec3d<float>,float>
                (Vec3d<float> *input,HaU32 inputCount,HaU32 clumpCount,Vec3d<float> *clusters,
                HaU32 *outputIndices,float threshold,float collapseDistance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  HaU32 i;
  int *__s;
  void *__s_00;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  float *pfVar8;
  int *piVar9;
  Vec3d<float> *pVVar10;
  ulong uVar11;
  HaU32 HVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  HaU32 HVar16;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 in_XMM11 [16];
  ulong uVar17;
  
  uVar5 = (ulong)inputCount;
  uVar14 = (ulong)clumpCount;
  __s = (int *)malloc(uVar14 * 4);
  if (clumpCount < inputCount) {
    __s_00 = malloc(uVar14 * 0xc);
    if (clumpCount != 0) {
      uVar7 = 0;
      lVar13 = 0;
      do {
        uVar5 = (ulong)uVar7 / (ulong)clumpCount;
        if (inputCount <= (uint)uVar5) {
          __assert_fail("index >= 0 && index < inputCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x2a5,
                        "hacd::HaU32 HACD::kmeans_cluster(const Vec *, hacd::HaU32, hacd::HaU32, Vec *, hacd::HaU32 *, Type, Type) [Vec = HACD::Vec3d<float>, Type = float]"
                       );
        }
        *(float *)((long)&clusters->z + lVar13) = input[uVar5].z;
        *(undefined8 *)((long)&clusters->x + lVar13) = *(undefined8 *)(input + uVar5);
        lVar13 = lVar13 + 0xc;
        uVar7 = uVar7 + inputCount;
      } while (uVar14 * 0xc != lVar13);
    }
    iVar15 = 0x40;
    fVar25 = 3.4028235e+38;
    do {
      if (clumpCount != 0) {
        memset(__s,0,uVar14 * 4);
        memset(__s_00,0,uVar14 * 0xc);
      }
      fVar23 = 0.0;
      uVar5 = 0;
      do {
        fVar21 = 3.4028235e+38;
        if (clumpCount != 0) {
          fVar1 = input[uVar5].x;
          fVar2 = input[uVar5].y;
          fVar3 = input[uVar5].z;
          uVar11 = 0;
          auVar22 = ZEXT1664(SUB6416(ZEXT464(0x7f7fffff),0));
          pfVar8 = &clusters->z;
          do {
            fVar21 = fVar2 - pfVar8[-1];
            auVar20 = ZEXT416((uint)(fVar1 - ((Vec3d<float> *)(pfVar8 + -2))->x));
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar20,auVar20);
            auVar24 = ZEXT416((uint)(fVar3 - *pfVar8));
            auVar20 = vfmadd231ss_fma(auVar20,auVar24,auVar24);
            if (auVar20._0_4_ < auVar22._0_4_) {
              outputIndices[uVar5] = (HaU32)uVar11;
              auVar22 = ZEXT1664(auVar20);
            }
            fVar21 = auVar22._0_4_;
            uVar11 = uVar11 + 1;
            pfVar8 = pfVar8 + 3;
          } while (uVar14 != uVar11);
        }
        fVar23 = fVar23 + fVar21;
        uVar11 = (ulong)outputIndices[uVar5];
        *(float *)((long)__s_00 + uVar11 * 0xc) =
             input[uVar5].x + *(float *)((long)__s_00 + uVar11 * 0xc);
        *(float *)((long)__s_00 + uVar11 * 0xc + 4) =
             input[uVar5].y + *(float *)((long)__s_00 + uVar11 * 0xc + 4);
        *(float *)((long)__s_00 + uVar11 * 0xc + 8) =
             input[uVar5].z + *(float *)((long)__s_00 + uVar11 * 0xc + 8);
        __s[uVar11] = __s[uVar11] + 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 != inputCount + (inputCount == 0));
      if (clumpCount != 0) {
        sVar6 = 0;
        piVar9 = __s;
        do {
          if (*piVar9 != 0) {
            auVar20 = vcvtusi2ss_avx512f(in_XMM11,*piVar9);
            fVar21 = 1.0 / auVar20._0_4_;
            *(float *)((long)__s_00 + sVar6) = fVar21 * *(float *)((long)__s_00 + sVar6);
            *(float *)((long)__s_00 + sVar6 + 4) = fVar21 * *(float *)((long)__s_00 + sVar6 + 4);
            *(float *)((long)__s_00 + sVar6 + 8) = fVar21 * *(float *)((long)__s_00 + sVar6 + 8);
            *(undefined4 *)((long)&clusters->z + sVar6) = *(undefined4 *)((long)__s_00 + sVar6 + 8);
            *(undefined8 *)((long)&clusters->x + sVar6) = *(undefined8 *)((long)__s_00 + sVar6);
          }
          piVar9 = piVar9 + 1;
          sVar6 = sVar6 + 0xc;
        } while (uVar14 * 0xc != sVar6);
      }
      iVar15 = iVar15 + -1;
    } while (((iVar15 != 0) && (threshold <= fVar23)) &&
            (auVar20._8_4_ = 0x7fffffff, auVar20._0_8_ = 0x7fffffff7fffffff,
            auVar20._12_4_ = 0x7fffffff,
            auVar20 = vandps_avx512vl(ZEXT416((uint)(fVar23 - fVar25)),auVar20), fVar25 = fVar23,
            threshold < auVar20._0_4_));
    free(__s_00);
    uVar5 = (ulong)clumpCount;
  }
  else if (inputCount != 0) {
    uVar14 = 0;
    pVVar10 = clusters;
    do {
      if (outputIndices != (HaU32 *)0x0) {
        outputIndices[uVar14] = (HaU32)uVar14;
      }
      pVVar10->z = input->z;
      fVar25 = input->y;
      pVVar10->x = input->x;
      pVVar10->y = fVar25;
      __s[uVar14] = 1;
      uVar14 = uVar14 + 1;
      input = input + 1;
      pVVar10 = pVVar10 + 1;
    } while (uVar5 != uVar14);
  }
  if ((int)uVar5 == 0) {
    HVar12 = 0;
  }
  else {
    fVar25 = collapseDistance * collapseDistance;
    uVar14 = 0;
    HVar12 = 0;
    do {
      if (__s[uVar14] != 0) {
        uVar11 = (ulong)HVar12;
        if (HVar12 == 0) {
          bVar4 = true;
          HVar16 = 0;
        }
        else {
          bVar4 = true;
          uVar19 = 0;
          uVar18 = (ulong)HVar12;
          pfVar8 = &clusters->z;
          do {
            fVar23 = clusters[uVar14].y - pfVar8[-1];
            auVar20 = ZEXT416((uint)(clusters[uVar14].x - ((Vec3d<float> *)(pfVar8 + -2))->x));
            auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar20,auVar20);
            auVar24 = ZEXT416((uint)(clusters[uVar14].z - *pfVar8));
            auVar20 = vfmadd231ss_fma(auVar20,auVar24,auVar24);
            fVar23 = auVar20._0_4_;
            if (fVar23 < fVar25) {
              bVar4 = false;
            }
            uVar17 = uVar19 & 0xffffffff;
            if (fVar25 <= fVar23) {
              uVar17 = uVar18;
            }
            HVar16 = (HaU32)uVar17;
            if (fVar23 < fVar25) break;
            uVar19 = uVar19 + 1;
            pfVar8 = pfVar8 + 3;
            uVar18 = uVar17;
          } while (uVar19 < uVar11);
        }
        if (outputIndices != (HaU32 *)0x0) {
          if (uVar14 == uVar11) {
            if (inputCount != 0 && !bVar4) {
LAB_0086ec57:
              uVar18 = 0;
              do {
                if (uVar14 == outputIndices[uVar18]) {
                  outputIndices[uVar18] = HVar16;
                }
                uVar18 = uVar18 + 1;
              } while (inputCount + (inputCount == 0) != uVar18);
            }
          }
          else if (inputCount != 0) goto LAB_0086ec57;
        }
        if (bVar4) {
          clusters[uVar11].z = clusters[uVar14].z;
          fVar23 = clusters[uVar14].y;
          clusters[uVar11].x = clusters[uVar14].x;
          clusters[uVar11].y = fVar23;
          HVar12 = HVar12 + 1;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar5);
  }
  free(__s);
  return HVar12;
}

Assistant:

hacd::HaU32	kmeans_cluster(const Vec *input,
						   hacd::HaU32 inputCount,
						   hacd::HaU32 clumpCount,
						   Vec *clusters,
						   hacd::HaU32 *outputIndices,
						   Type threshold, // controls how long it works to converge towards a least errors solution.
						   Type collapseDistance) // distance between clumps to consider them to be essentially equal.
{
	hacd::HaU32 convergeCount = 64; // maximum number of iterations attempting to converge to a solution..
	hacd::HaU32 *counts = (hacd::HaU32 *)HACD_ALLOC(sizeof(hacd::HaU32)*clumpCount);
	Type error=0;
	if ( inputCount <= clumpCount ) // if the number of input points is less than our clumping size, just return the input points.
	{
		clumpCount = inputCount;
		for (hacd::HaU32 i=0; i<inputCount; i++)
		{
			if ( outputIndices )
			{
				outputIndices[i] = i;
			}
			clusters[i] = input[i];
			counts[i] = 1;
		}
	}
	else
	{
		Vec *centroids = (Vec *)HACD_ALLOC(sizeof(Vec)*clumpCount);

		// Take a sampling of the input points as initial centroid estimates.
		for (hacd::HaU32 i=0; i<clumpCount; i++)
		{
			hacd::HaU32 index = (i*inputCount)/clumpCount;
			assert( index >= 0 && index < inputCount );
			clusters[i] = input[index];
		}

		// Here is the main convergence loop
		Type old_error = FLT_MAX;	// old and initial error estimates are max Type
		error = FLT_MAX;
		do
		{
			old_error = error;	// preserve the old error
			// reset the counts and centroids to current cluster location
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				counts[i] = 0;
				centroids[i].zero();
			}
			error = 0;
			// For each input data point, figure out which cluster it is closest too and add it to that cluster.
			for (hacd::HaU32 i=0; i<inputCount; i++)
			{
				Type min_distance = FLT_MAX;
				// find the nearest clump to this point.
				for (hacd::HaU32 j=0; j<clumpCount; j++)
				{
					Type distance = input[i].distanceSquared( clusters[j] );
					if ( distance < min_distance )
					{
						min_distance = distance;
						outputIndices[i] = j; // save which clump this point indexes
					}
				}
				hacd::HaU32 index = outputIndices[i]; // which clump was nearest to this point.
				centroids[index]+=input[i];
				counts[index]++;	// increment the counter indicating how many points are in this clump.
				error+=min_distance; // save the error accumulation
			}
			// Now, for each clump, compute the mean and store the result.
			for (hacd::HaU32 i=0; i<clumpCount; i++)
			{
				if ( counts[i] ) // if this clump got any points added to it...
				{
					Type recip = 1.0f / (Type)counts[i];	// compute the average (center of those points)
					centroids[i]*=recip;	// compute the average center of the points in this clump.
					clusters[i] = centroids[i]; // store it as the new cluster.
				}
			}
			// decrement the convergence counter and bail if it is taking too long to converge to a solution.
			convergeCount--;
			if (convergeCount == 0 )
			{
				break;
			}
			if ( error < threshold ) // early exit if our first guess is already good enough (if all input points are the same)
				break;
		} while ( fabs(error - old_error) > threshold ); // keep going until the error is reduced by this threshold amount.

		HACD_FREE(centroids);
	}

	// ok..now we prune the clumps if necessary.
	// The rules are; first, if a clump has no 'counts' then we prune it as it's unused.
	// The second, is if the centroid of this clump is essentially  the same (based on the distance tolerance)
	// as an existing clump, then it is pruned and all indices which used to point to it, now point to the one
	// it is closest too.
	hacd::HaU32 outCount = 0; // number of clumps output after pruning performed.
	Type d2 = collapseDistance*collapseDistance; // squared collapse distance.
	for (hacd::HaU32 i=0; i<clumpCount; i++)
	{
		if ( counts[i] == 0 ) // if no points ended up in this clump, eliminate it.
			continue;
		// see if this clump is too close to any already accepted clump.
		bool add = true;
		hacd::HaU32 remapIndex = outCount; // by default this clump will be remapped to its current index.
		for (hacd::HaU32 j=0; j<outCount; j++)
		{
			Type distance = clusters[i].distanceSquared(clusters[j]);
			if ( distance < d2 )
			{
				remapIndex = j;
				add = false; // we do not add this clump
				break;
			}
		}
		// If we have fewer output clumps than input clumps so far, then we need to remap the old indices to the new ones.
		if ( outputIndices )
		{
			if ( outCount != i || !add ) // we need to remap indices!  everything that was index 'i' now needs to be remapped to 'outCount'
			{
				for (hacd::HaU32 j=0; j<inputCount; j++)
				{
					if ( outputIndices[j] == i )
					{
						outputIndices[j] = remapIndex; //
					}
				}
			}
		}
		if ( add )
		{
			clusters[outCount] = clusters[i];
			outCount++;
		}
	}
	HACD_FREE(counts);
	clumpCount = outCount;
	return clumpCount;
}